

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_striped_avx2_256_16.c
# Opt level: O2

parasail_result_t *
parasail_nw_striped_profile_avx2_256_16
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  __m256i alVar1;
  uint uVar2;
  void *pvVar3;
  parasail_matrix_t *ppVar4;
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  short sVar7;
  int16_t iVar8;
  int iVar9;
  parasail_result_t *ppVar10;
  __m256i *palVar11;
  __m256i *ptr;
  __m256i *ptr_00;
  int16_t *ptr_01;
  long lVar12;
  __m256i *palVar13;
  undefined4 uVar14;
  char *pcVar15;
  long lVar16;
  uint uVar17;
  char *__format;
  long lVar18;
  long lVar19;
  ulong uVar20;
  int iVar21;
  int32_t segNum;
  long lVar22;
  int iVar23;
  ulong size;
  undefined2 uVar24;
  undefined1 auVar25 [16];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [16];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  __m256i_16_t e;
  __m256i_16_t h;
  longlong local_a0;
  longlong lStack_98;
  longlong lStack_90;
  longlong lStack_88;
  longlong local_80;
  longlong lStack_78;
  longlong lStack_70;
  longlong lStack_68;
  undefined1 auVar26 [32];
  
  if (profile == (parasail_profile_t *)0x0) {
    __format = "%s: missing %s\n";
    pcVar15 = "profile";
  }
  else {
    pvVar3 = (profile->profile16).score;
    if (pvVar3 == (void *)0x0) {
      __format = "%s: missing %s\n";
      pcVar15 = "profile->profile16.score";
    }
    else {
      ppVar4 = profile->matrix;
      if (ppVar4 == (parasail_matrix_t *)0x0) {
        __format = "%s: missing %s\n";
        pcVar15 = "profile->matrix";
      }
      else {
        uVar2 = profile->s1Len;
        if ((int)uVar2 < 1) {
          __format = "%s: %s must be > 0\n";
          pcVar15 = "profile->s1Len";
        }
        else if (s2 == (char *)0x0) {
          __format = "%s: missing %s\n";
          pcVar15 = "s2";
        }
        else if (s2Len < 1) {
          __format = "%s: %s must be > 0\n";
          pcVar15 = "s2Len";
        }
        else if (open < 0) {
          __format = "%s: %s must be >= 0\n";
          pcVar15 = "open";
        }
        else {
          if (-1 < gap) {
            uVar17 = uVar2 - 1;
            size = (ulong)uVar2 + 0xf >> 4;
            iVar21 = -open;
            iVar9 = ppVar4->min;
            iVar23 = -iVar9;
            if (iVar9 != iVar21 && SBORROW4(iVar9,iVar21) == iVar9 + open < 0) {
              iVar23 = open;
            }
            sVar7 = 0x7ffe - (short)ppVar4->max;
            ppVar10 = parasail_result_new();
            if (ppVar10 != (parasail_result_t *)0x0) {
              ppVar10->flag = ppVar10->flag | 0x10200801;
              palVar11 = parasail_memalign___m256i(0x20,size);
              ptr = parasail_memalign___m256i(0x20,size);
              ptr_00 = parasail_memalign___m256i(0x20,size);
              ptr_01 = parasail_memalign_int16_t(0x20,(ulong)(s2Len + 1));
              if ((ptr_01 != (int16_t *)0x0 && ptr_00 != (__m256i *)0x0) &&
                  (ptr != (__m256i *)0x0 && palVar11 != (__m256i *)0x0)) {
                iVar9 = s2Len + -1;
                uVar24 = (undefined2)open;
                auVar28._2_2_ = uVar24;
                auVar28._0_2_ = uVar24;
                auVar28._4_2_ = uVar24;
                auVar28._6_2_ = uVar24;
                auVar28._8_2_ = uVar24;
                auVar28._10_2_ = uVar24;
                auVar28._12_2_ = uVar24;
                auVar28._14_2_ = uVar24;
                auVar28._16_2_ = uVar24;
                auVar28._18_2_ = uVar24;
                auVar28._20_2_ = uVar24;
                auVar28._22_2_ = uVar24;
                auVar28._24_2_ = uVar24;
                auVar28._26_2_ = uVar24;
                auVar28._28_2_ = uVar24;
                auVar28._30_2_ = uVar24;
                uVar24 = (undefined2)gap;
                auVar29._2_2_ = uVar24;
                auVar29._0_2_ = uVar24;
                auVar29._4_2_ = uVar24;
                auVar29._6_2_ = uVar24;
                auVar29._8_2_ = uVar24;
                auVar29._10_2_ = uVar24;
                auVar29._12_2_ = uVar24;
                auVar29._14_2_ = uVar24;
                auVar29._16_2_ = uVar24;
                auVar29._18_2_ = uVar24;
                auVar29._20_2_ = uVar24;
                auVar29._22_2_ = uVar24;
                auVar29._24_2_ = uVar24;
                auVar29._26_2_ = uVar24;
                auVar29._28_2_ = uVar24;
                auVar29._30_2_ = uVar24;
                auVar25._0_2_ = (undefined2)(iVar23 + -0x7fff);
                auVar25._2_2_ = auVar25._0_2_;
                auVar25._4_2_ = auVar25._0_2_;
                auVar25._6_2_ = auVar25._0_2_;
                auVar25._8_2_ = auVar25._0_2_;
                auVar25._10_2_ = auVar25._0_2_;
                auVar25._12_2_ = auVar25._0_2_;
                auVar25._14_2_ = auVar25._0_2_;
                auVar26._16_2_ = auVar25._0_2_;
                auVar26._0_16_ = auVar25;
                auVar26._18_2_ = auVar25._0_2_;
                auVar26._20_2_ = auVar25._0_2_;
                auVar26._22_2_ = auVar25._0_2_;
                auVar26._24_2_ = auVar25._0_2_;
                auVar26._26_2_ = auVar25._0_2_;
                auVar26._28_2_ = auVar25._0_2_;
                auVar26._30_2_ = auVar25._0_2_;
                auVar27._2_2_ = sVar7;
                auVar27._0_2_ = sVar7;
                auVar27._4_2_ = sVar7;
                auVar27._6_2_ = sVar7;
                auVar27._8_2_ = sVar7;
                auVar27._10_2_ = sVar7;
                auVar27._12_2_ = sVar7;
                auVar27._14_2_ = sVar7;
                auVar27._16_2_ = sVar7;
                auVar27._18_2_ = sVar7;
                auVar27._20_2_ = sVar7;
                auVar27._22_2_ = sVar7;
                auVar27._24_2_ = sVar7;
                auVar27._26_2_ = sVar7;
                auVar27._28_2_ = sVar7;
                auVar27._30_2_ = sVar7;
                lVar16 = (long)iVar21;
                for (uVar20 = 0; uVar20 != size; uVar20 = uVar20 + 1) {
                  lVar19 = lVar16;
                  for (lVar22 = 0; lVar22 != 0x10; lVar22 = lVar22 + 1) {
                    lVar18 = -0x8000;
                    if (-0x8000 < lVar19) {
                      lVar18 = lVar19;
                    }
                    lVar12 = lVar19 - (ulong)(uint)open;
                    if (lVar12 < -0x7fff) {
                      lVar12 = -0x8000;
                    }
                    *(short *)((long)&local_80 + lVar22 * 2) = (short)lVar18;
                    *(short *)((long)&local_a0 + lVar22 * 2) = (short)lVar12;
                    lVar19 = lVar19 - size * (uint)gap;
                  }
                  palVar13 = palVar11 + uVar20;
                  (*palVar13)[0] = local_80;
                  (*palVar13)[1] = lStack_78;
                  (*palVar13)[2] = lStack_70;
                  (*palVar13)[3] = lStack_68;
                  palVar13 = ptr_00 + uVar20;
                  (*palVar13)[0] = local_a0;
                  (*palVar13)[1] = lStack_98;
                  (*palVar13)[2] = lStack_90;
                  (*palVar13)[3] = lStack_88;
                  lVar16 = lVar16 - (ulong)(uint)gap;
                }
                *ptr_01 = 0;
                for (uVar20 = 1; s2Len + 1 != uVar20; uVar20 = uVar20 + 1) {
                  iVar8 = -0x8000;
                  if (-0x8000 < iVar21) {
                    iVar8 = (int16_t)iVar21;
                  }
                  ptr_01[uVar20] = iVar8;
                  iVar21 = iVar21 - gap;
                }
                uVar20 = 0;
                auVar31 = ZEXT3264(auVar27);
                auVar30 = ZEXT3264(auVar26);
                do {
                  palVar13 = palVar11;
                  if (uVar20 == (uint)s2Len) {
                    alVar1 = palVar13[(ulong)uVar17 % size];
                    for (iVar23 = 0; iVar23 < 0xf - (int)(uVar17 / size); iVar23 = iVar23 + 1) {
                      auVar28 = vperm2i128_avx2((undefined1  [32])alVar1,(undefined1  [32])alVar1,
                                                0x28);
                      alVar1 = (__m256i)vpalignr_avx2((undefined1  [32])alVar1,auVar28,0xe);
                    }
                    auVar26 = vpcmpgtw_avx2(auVar26,auVar31._0_32_);
                    auVar27 = vpcmpgtw_avx2(auVar30._0_32_,auVar27);
                    auVar26 = vpor_avx2(auVar27,auVar26);
                    if ((((((((((((((((((((((((((((((((auVar26 >> 7 & (undefined1  [32])0x1) ==
                                                      (undefined1  [32])0x0 &&
                                                     (auVar26 >> 0xf & (undefined1  [32])0x1) ==
                                                     (undefined1  [32])0x0) &&
                                                    (auVar26 >> 0x17 & (undefined1  [32])0x1) ==
                                                    (undefined1  [32])0x0) &&
                                                   (auVar26 >> 0x1f & (undefined1  [32])0x1) ==
                                                   (undefined1  [32])0x0) &&
                                                  (auVar26 >> 0x27 & (undefined1  [32])0x1) ==
                                                  (undefined1  [32])0x0) &&
                                                 (auVar26 >> 0x2f & (undefined1  [32])0x1) ==
                                                 (undefined1  [32])0x0) &&
                                                (auVar26 >> 0x37 & (undefined1  [32])0x1) ==
                                                (undefined1  [32])0x0) &&
                                               (auVar26 >> 0x3f & (undefined1  [32])0x1) ==
                                               (undefined1  [32])0x0) &&
                                              (auVar26 >> 0x47 & (undefined1  [32])0x1) ==
                                              (undefined1  [32])0x0) &&
                                             (auVar26 >> 0x4f & (undefined1  [32])0x1) ==
                                             (undefined1  [32])0x0) &&
                                            (auVar26 >> 0x57 & (undefined1  [32])0x1) ==
                                            (undefined1  [32])0x0) &&
                                           (auVar26 >> 0x5f & (undefined1  [32])0x1) ==
                                           (undefined1  [32])0x0) &&
                                          (auVar26 >> 0x67 & (undefined1  [32])0x1) ==
                                          (undefined1  [32])0x0) &&
                                         (auVar26 >> 0x6f & (undefined1  [32])0x1) ==
                                         (undefined1  [32])0x0) &&
                                        (auVar26 >> 0x77 & (undefined1  [32])0x1) ==
                                        (undefined1  [32])0x0) && SUB321(auVar26 >> 0x7f,0) == '\0')
                                      && (auVar26 >> 0x87 & (undefined1  [32])0x1) ==
                                         (undefined1  [32])0x0) &&
                                     (auVar26 >> 0x8f & (undefined1  [32])0x1) ==
                                     (undefined1  [32])0x0) &&
                                    (auVar26 >> 0x97 & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) &&
                                   (auVar26 >> 0x9f & (undefined1  [32])0x1) ==
                                   (undefined1  [32])0x0) &&
                                  (auVar26 >> 0xa7 & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                  ) && (auVar26 >> 0xaf & (undefined1  [32])0x1) ==
                                       (undefined1  [32])0x0) &&
                                (auVar26 >> 0xb7 & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                               && SUB321(auVar26 >> 0xbf,0) == '\0') &&
                              (auVar26 >> 199 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                             (auVar26 >> 0xcf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar26 >> 0xd7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           (auVar26 >> 0xdf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar26 >> 0xe7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         (auVar26 >> 0xef & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar26 >> 0xf7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        -1 < auVar26[0x1f]) {
                      uVar14 = vpextrw_avx(alVar1._16_16_,7);
                      sVar7 = (short)uVar14;
                    }
                    else {
                      *(byte *)&ppVar10->flag = (byte)ppVar10->flag | 0x40;
                      sVar7 = 0;
                      iVar9 = 0;
                      uVar17 = 0;
                    }
                    ppVar10->score = (int)sVar7;
                    ppVar10->end_query = uVar17;
                    ppVar10->end_ref = iVar9;
                    parasail_free(ptr_01);
                    parasail_free(ptr_00);
                    parasail_free(ptr);
                    parasail_free(palVar13);
                    return ppVar10;
                  }
                  auVar32 = SUB3216(palVar13[(int)size - 1],0);
                  auVar33._0_16_ = ZEXT116(0) * auVar32 + ZEXT116(1) * auVar25;
                  auVar33._16_16_ = ZEXT116(0) * auVar26._16_16_ + ZEXT116(1) * auVar32;
                  auVar33 = vpalignr_avx2((undefined1  [32])palVar13[(int)size - 1],auVar33,0xe);
                  iVar23 = ppVar4->mapper[(byte)s2[uVar20]];
                  auVar32 = vpinsrw_avx(auVar33._0_16_,(uint)(ushort)ptr_01[uVar20],0);
                  auVar33 = vpblendd_avx2(auVar33,ZEXT1632(auVar32),0xf);
                  auVar6 = auVar26;
                  for (lVar16 = 0; size * 0x20 != lVar16; lVar16 = lVar16 + 0x20) {
                    auVar34 = vpaddsw_avx2(auVar33,*(undefined1 (*) [32])
                                                    ((long)pvVar3 +
                                                    lVar16 + (long)(iVar23 * (int)size) * 0x20));
                    auVar33 = *(undefined1 (*) [32])((long)*ptr_00 + lVar16);
                    auVar5 = vpmaxsw_avx2(auVar33,auVar6);
                    auVar34 = vpmaxsw_avx2(auVar5,auVar34);
                    *(undefined1 (*) [32])((long)*ptr + lVar16) = auVar34;
                    auVar5 = vpmaxsw_avx2(auVar30._0_32_,auVar34);
                    auVar30 = ZEXT3264(auVar5);
                    auVar5 = vpminsw_avx2(auVar33,auVar31._0_32_);
                    auVar5 = vpminsw_avx2(auVar5,auVar6);
                    auVar5 = vpminsw_avx2(auVar5,auVar34);
                    auVar31 = ZEXT3264(auVar5);
                    auVar34 = vpsubsw_avx2(auVar34,auVar28);
                    auVar33 = vpsubsw_avx2(auVar33,auVar29);
                    auVar33 = vpmaxsw_avx2(auVar33,auVar34);
                    *(undefined1 (*) [32])((long)*ptr_00 + lVar16) = auVar33;
                    auVar33 = vpsubsw_avx2(auVar6,auVar29);
                    auVar6 = vpmaxsw_avx2(auVar33,auVar34);
                    auVar33 = *(undefined1 (*) [32])((long)*palVar13 + lVar16);
                  }
                  for (iVar23 = 0; iVar23 != 0x10; iVar23 = iVar23 + 1) {
                    iVar21 = ptr_01[uVar20 + 1] - open;
                    if (iVar21 < -0x7fff) {
                      iVar21 = -0x8000;
                    }
                    auVar34._0_16_ = ZEXT116(0) * auVar6._0_16_ + ZEXT116(1) * auVar25;
                    auVar34._16_16_ = ZEXT116(0) * auVar26._16_16_ + ZEXT116(1) * auVar6._0_16_;
                    auVar33 = vpalignr_avx2(auVar6,auVar34,0xe);
                    auVar32 = vpinsrw_avx(auVar33._0_16_,iVar21,0);
                    auVar6 = vpblendd_avx2(auVar33,ZEXT1632(auVar32),0xf);
                    lVar16 = 0;
                    while (size * 0x20 + 0x20 != lVar16 + 0x20) {
                      auVar33 = vpmaxsw_avx2(auVar6,*(undefined1 (*) [32])((long)*ptr + lVar16));
                      *(undefined1 (*) [32])((long)*ptr + lVar16) = auVar33;
                      auVar34 = vpminsw_avx2(auVar31._0_32_,auVar33);
                      auVar31 = ZEXT3264(auVar34);
                      auVar34 = vpmaxsw_avx2(auVar30._0_32_,auVar33);
                      auVar30 = ZEXT3264(auVar34);
                      auVar33 = vpsubsw_avx2(auVar33,auVar28);
                      auVar6 = vpsubsw_avx2(auVar6,auVar29);
                      auVar33 = vpcmpgtw_avx2(auVar6,auVar33);
                      lVar16 = lVar16 + 0x20;
                      if ((((((((((((((((((((((((((((((((auVar33 >> 7 & (undefined1  [32])0x1) ==
                                                        (undefined1  [32])0x0 &&
                                                       (auVar33 >> 0xf & (undefined1  [32])0x1) ==
                                                       (undefined1  [32])0x0) &&
                                                      (auVar33 >> 0x17 & (undefined1  [32])0x1) ==
                                                      (undefined1  [32])0x0) &&
                                                     (auVar33 >> 0x1f & (undefined1  [32])0x1) ==
                                                     (undefined1  [32])0x0) &&
                                                    (auVar33 >> 0x27 & (undefined1  [32])0x1) ==
                                                    (undefined1  [32])0x0) &&
                                                   (auVar33 >> 0x2f & (undefined1  [32])0x1) ==
                                                   (undefined1  [32])0x0) &&
                                                  (auVar33 >> 0x37 & (undefined1  [32])0x1) ==
                                                  (undefined1  [32])0x0) &&
                                                 (auVar33 >> 0x3f & (undefined1  [32])0x1) ==
                                                 (undefined1  [32])0x0) &&
                                                (auVar33 >> 0x47 & (undefined1  [32])0x1) ==
                                                (undefined1  [32])0x0) &&
                                               (auVar33 >> 0x4f & (undefined1  [32])0x1) ==
                                               (undefined1  [32])0x0) &&
                                              (auVar33 >> 0x57 & (undefined1  [32])0x1) ==
                                              (undefined1  [32])0x0) &&
                                             (auVar33 >> 0x5f & (undefined1  [32])0x1) ==
                                             (undefined1  [32])0x0) &&
                                            (auVar33 >> 0x67 & (undefined1  [32])0x1) ==
                                            (undefined1  [32])0x0) &&
                                           (auVar33 >> 0x6f & (undefined1  [32])0x1) ==
                                           (undefined1  [32])0x0) &&
                                          (auVar33 >> 0x77 & (undefined1  [32])0x1) ==
                                          (undefined1  [32])0x0) &&
                                         SUB321(auVar33 >> 0x7f,0) == '\0') &&
                                        (auVar33 >> 0x87 & (undefined1  [32])0x1) ==
                                        (undefined1  [32])0x0) &&
                                       (auVar33 >> 0x8f & (undefined1  [32])0x1) ==
                                       (undefined1  [32])0x0) &&
                                      (auVar33 >> 0x97 & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0) &&
                                     (auVar33 >> 0x9f & (undefined1  [32])0x1) ==
                                     (undefined1  [32])0x0) &&
                                    (auVar33 >> 0xa7 & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) &&
                                   (auVar33 >> 0xaf & (undefined1  [32])0x1) ==
                                   (undefined1  [32])0x0) &&
                                  (auVar33 >> 0xb7 & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                  ) && SUB321(auVar33 >> 0xbf,0) == '\0') &&
                                (auVar33 >> 199 & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                               && (auVar33 >> 0xcf & (undefined1  [32])0x1) == (undefined1  [32])0x0
                               ) && (auVar33 >> 0xd7 & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) &&
                             (auVar33 >> 0xdf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar33 >> 0xe7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           (auVar33 >> 0xef & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar33 >> 0xf7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          -1 < auVar33[0x1f]) goto LAB_0071b911;
                    }
                  }
LAB_0071b911:
                  uVar20 = uVar20 + 1;
                  palVar11 = ptr;
                  ptr = palVar13;
                } while( true );
              }
            }
            return (parasail_result_t *)0x0;
          }
          __format = "%s: %s must be >= 0\n";
          pcVar15 = "gap";
        }
      }
    }
  }
  fprintf(_stderr,__format,"parasail_nw_striped_profile_avx2_256_16",pcVar15);
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m256i* restrict vProfile = NULL;
    __m256i* restrict pvHStore = NULL;
    __m256i* restrict pvHLoad = NULL;
    __m256i* restrict pvE = NULL;
    int16_t* restrict boundary = NULL;
    __m256i vGapO;
    __m256i vGapE;
    int16_t NEG_LIMIT = 0;
    int16_t POS_LIMIT = 0;
    int16_t score = 0;
    __m256i vNegLimit;
    __m256i vPosLimit;
    __m256i vSaturationCheckMin;
    __m256i vSaturationCheckMax;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile16.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 16; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    vProfile = (__m256i*)profile->profile16.score;
    vGapO = _mm256_set1_epi16(open);
    vGapE = _mm256_set1_epi16(gap);
    NEG_LIMIT = (-open < matrix->min ? INT16_MIN + open : INT16_MIN - matrix->min) + 1;
    POS_LIMIT = INT16_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm256_set1_epi16(NEG_LIMIT);
    vPosLimit = _mm256_set1_epi16(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_BITS_16 | PARASAIL_FLAG_LANES_16;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore = parasail_memalign___m256i(32, segLen);
    pvHLoad  = parasail_memalign___m256i(32, segLen);
    pvE      = parasail_memalign___m256i(32, segLen);
    boundary = parasail_memalign_int16_t(32, s2Len+1);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvE) return NULL;
    if (!boundary) return NULL;

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m256i_16_t h;
            __m256i_16_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = -open-gap*(segNum*segLen+i);
                h.v[segNum] = tmp < INT16_MIN ? INT16_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT16_MIN ? INT16_MIN : tmp;
            }
            _mm256_store_si256(&pvHStore[index], h.m);
            _mm256_store_si256(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = -open-gap*(i-1);
            boundary[i] = tmp < INT16_MIN ? INT16_MIN : tmp;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m256i vE;
        /* Initialize F value to -inf.  Any errors to vH values will be
         * corrected in the Lazy_F loop.  */
        __m256i vF = vNegLimit;

        /* load final segment of pvHStore and shift left by 2 bytes */
        __m256i vH = _mm256_slli_si256_rpl(pvHStore[segLen - 1], 2);

        /* Correct part of the vProfile */
        const __m256i* vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;

        /* Swap the 2 H buffers. */
        __m256i* pv = pvHLoad;
        pvHLoad = pvHStore;
        pvHStore = pv;

        /* insert upper boundary condition */
        vH = _mm256_insert_epi16_rpl(vH, boundary[j], 0);

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            vH = _mm256_adds_epi16(vH, _mm256_load_si256(vP + i));
            vE = _mm256_load_si256(pvE + i);

            /* Get max from vH, vE and vF. */
            vH = _mm256_max_epi16(vH, vE);
            vH = _mm256_max_epi16(vH, vF);
            /* Save vH values. */
            _mm256_store_si256(pvHStore + i, vH);
            vSaturationCheckMax = _mm256_max_epi16(vSaturationCheckMax, vH);
            vSaturationCheckMin = _mm256_min_epi16(vSaturationCheckMin, vH);
            vSaturationCheckMin = _mm256_min_epi16(vSaturationCheckMin, vE);
            vSaturationCheckMin = _mm256_min_epi16(vSaturationCheckMin, vF);
#ifdef PARASAIL_TABLE
            arr_store_si256(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif

            /* Update vE value. */
            vH = _mm256_subs_epi16(vH, vGapO);
            vE = _mm256_subs_epi16(vE, vGapE);
            vE = _mm256_max_epi16(vE, vH);
            _mm256_store_si256(pvE + i, vE);

            /* Update vF value. */
            vF = _mm256_subs_epi16(vF, vGapE);
            vF = _mm256_max_epi16(vF, vH);

            /* Load the next vH. */
            vH = _mm256_load_si256(pvHLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            int64_t tmp = boundary[j+1]-open;
            int16_t tmp2 = tmp < INT16_MIN ? INT16_MIN : tmp;
            vF = _mm256_slli_si256_rpl(vF, 2);
            vF = _mm256_insert_epi16_rpl(vF, tmp2, 0);
            for (i=0; i<segLen; ++i) {
                vH = _mm256_load_si256(pvHStore + i);
                vH = _mm256_max_epi16(vH,vF);
                _mm256_store_si256(pvHStore + i, vH);
                vSaturationCheckMin = _mm256_min_epi16(vSaturationCheckMin, vH);
                vSaturationCheckMax = _mm256_max_epi16(vSaturationCheckMax, vH);
#ifdef PARASAIL_TABLE
                arr_store_si256(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
                vH = _mm256_subs_epi16(vH, vGapO);
                vF = _mm256_subs_epi16(vF, vGapE);
                if (! _mm256_movemask_epi8(_mm256_cmpgt_epi16(vF, vH))) goto end;
                /*vF = _mm256_max_epi16(vF, vH);*/
            }
        }
end:
        {
        }

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm256_load_si256(pvHStore + offset);
            for (k=0; k<position; ++k) {
                vH = _mm256_slli_si256_rpl(vH, 2);
            }
            result->rowcols->score_row[j] = (int16_t) _mm256_extract_epi16_rpl (vH, 15);
        }
#endif
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m256i vH = _mm256_load_si256(pvHStore+i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    /* extract last value from the last column */
    {
        __m256i vH = _mm256_load_si256(pvHStore + offset);
        for (k=0; k<position; ++k) {
            vH = _mm256_slli_si256_rpl (vH, 2);
        }
        score = (int16_t) _mm256_extract_epi16_rpl (vH, 15);
    }

    if (_mm256_movemask_epi8(_mm256_or_si256(
            _mm256_cmplt_epi16_rpl(vSaturationCheckMin, vNegLimit),
            _mm256_cmpgt_epi16(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(boundary);
    parasail_free(pvE);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}